

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

int32_t __thiscall
cornelich::vanilla_index::last_index_file_number
          (vanilla_index *this,int32_t cycle,int32_t default_cycle)

{
  type_conflict tVar1;
  bool bVar2;
  string *s;
  cycle_formatter *cycle_00;
  reference this_00;
  string_type *psVar3;
  difference_type __n;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  int32_t local_1bc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  int local_154;
  undefined1 local_150 [4];
  int32_t index;
  string local_130 [8];
  string_type name;
  directory_entry *entry;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_f0;
  iterator_range<boost::filesystem::directory_iterator> local_e8;
  iterator_range<boost::filesystem::directory_iterator> *local_d8;
  iterator_range<boost::filesystem::directory_iterator> *__range1;
  directory_iterator end;
  directory_iterator begin;
  error_code err;
  undefined1 local_a0 [64];
  path local_60;
  undefined1 local_40 [8];
  path path;
  int32_t last_number;
  int32_t default_cycle_local;
  int32_t cycle_local;
  vanilla_index *this_local;
  
  path._28_4_ = 0xffffffff;
  s = vanilla_chronicle_settings::path_abi_cxx11_(this->m_settings);
  boost::filesystem::path::path(&local_60,s);
  cycle_00 = vanilla_chronicle_settings::cycle_format(this->m_settings);
  cycle_formatter::date_from_cycle_abi_cxx11_((cycle_formatter *)local_a0,(int64_t)cycle_00);
  boost::filesystem::path::path((path *)(local_a0 + 0x20),(string_type *)local_a0);
  boost::filesystem::operator/((path *)local_40,&local_60,(path *)(local_a0 + 0x20));
  boost::filesystem::path::~path((path *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)local_a0);
  boost::filesystem::path::~path(&local_60);
  boost::system::error_code::error_code((error_code *)&begin);
  boost::filesystem::directory_iterator::directory_iterator
            (&end,(path *)local_40,(error_code *)&begin);
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)&__range1);
  boost::filesystem::directory_iterator::directory_iterator(&local_f0,&end);
  boost::filesystem::directory_iterator::directory_iterator
            (&__begin1,(directory_iterator *)&__range1);
  boost::make_iterator_range<boost::filesystem::directory_iterator>
            ((boost *)&local_e8,&local_f0,&__begin1);
  boost::filesystem::directory_iterator::~directory_iterator(&__begin1);
  boost::filesystem::directory_iterator::~directory_iterator(&local_f0);
  local_d8 = &local_e8;
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::begin((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
           *)&__end1);
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::end((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
         *)&entry);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&__end1,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&entry), tVar1) {
    this_00 = boost::iterators::detail::
              iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)&__end1);
    boost::filesystem::directory_entry::path(this_00);
    boost::filesystem::path::filename();
    psVar3 = boost::filesystem::path::native_abi_cxx11_((path *)local_150);
    std::__cxx11::string::string(local_130,(string *)psVar3);
    boost::filesystem::path::~path((path *)local_150);
    bVar2 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       INDEX_FILE_NAME_PREFIX_abi_cxx11_);
    if (bVar2) {
      local_154 = -1;
      local_170._M_current = (char *)std::__cxx11::string::begin();
      __n = std::__cxx11::string::size();
      local_168 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator+(&local_170,__n);
      local_160 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_168,1);
      end_00._M_current = (char *)std::__cxx11::string::end();
      util::parse_number<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (local_160,end_00,&local_154);
      if ((int)path._28_4_ < local_154) {
        path._28_4_ = local_154;
      }
    }
    std::__cxx11::string::~string(local_130);
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)&__end1);
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&entry);
  boost::filesystem::directory_iterator::~directory_iterator(&__end1);
  boost::iterator_range<boost::filesystem::directory_iterator>::~iterator_range(&local_e8);
  local_1bc = default_cycle;
  if (path._28_4_ != -1) {
    local_1bc = path._28_4_;
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&__range1);
  boost::filesystem::directory_iterator::~directory_iterator(&end);
  boost::filesystem::path::~path((path *)local_40);
  return local_1bc;
}

Assistant:

std::int32_t vanilla_index::last_index_file_number(std::int32_t cycle, std::int32_t default_cycle) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    // Find the last index file in the specified cycle directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, INDEX_FILE_NAME_PREFIX))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + static_cast<std::string::difference_type>(INDEX_FILE_NAME_PREFIX.size()) - 1, name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    return last_number == -1 ? default_cycle : last_number;
}